

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Entity.cpp
# Opt level: O0

void __thiscall Entity::render_four(Entity *this,ALLEGRO_COLOR tint)

{
  long *in_RDI;
  undefined4 in_XMM0_Da;
  undefined8 in_XMM1_Qa;
  int ox;
  int local_1c;
  
  (**(code **)(*in_RDI + 0x10))(in_XMM0_Da,in_XMM1_Qa,in_RDI,0,0,0);
  if (*(float *)(in_RDI + 1) <= (float)(BB_W / 2)) {
    local_1c = BB_W;
    (**(code **)(*in_RDI + 0x10))(in_XMM0_Da,in_XMM1_Qa,in_RDI,BB_W,0,0);
  }
  else {
    local_1c = -BB_W;
    (**(code **)(*in_RDI + 0x10))(in_XMM0_Da,in_XMM1_Qa,in_RDI,local_1c,0,0);
  }
  if (*(float *)((long)in_RDI + 0xc) <= (float)(BB_H / 2)) {
    (**(code **)(*in_RDI + 0x10))(in_XMM0_Da,in_XMM1_Qa,in_RDI,0,BB_H);
    (**(code **)(*in_RDI + 0x10))(in_XMM0_Da,in_XMM1_Qa,in_RDI,local_1c,BB_H);
  }
  else {
    (**(code **)(*in_RDI + 0x10))(in_XMM0_Da,in_XMM1_Qa,in_RDI,0,-BB_H);
    (**(code **)(*in_RDI + 0x10))(in_XMM0_Da,in_XMM1_Qa,in_RDI,local_1c,-BB_H);
  }
  return;
}

Assistant:

void Entity::render_four(ALLEGRO_COLOR tint)
{
   int ox = 0;
   render(0, 0, tint);
   if (x > BB_W / 2) {
      ox = -BB_W;
      render(ox, 0, tint);
   }
   else {
      ox = BB_W;
      render(ox, 0, tint);
   }
   if (y > BB_H / 2) {
      render(0, -BB_H, tint);
      render(ox, -BB_H, tint);
   }
   else {
      render(0, BB_H, tint);
      render(ox, BB_H, tint);
   }
}